

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O3

REF_STATUS
ref_facelift_enclosing
          (REF_FACELIFT ref_facelift,REF_INT type,REF_INT id,REF_DBL *param,REF_INT *cell,
          REF_DBL *bary)

{
  REF_INT RVar1;
  REF_CELL pRVar2;
  uint uVar3;
  undefined8 uVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  REF_LIST ref_list;
  REF_DBL current_bary [3];
  REF_INT nodes [27];
  REF_LIST local_110;
  REF_DBL *local_108;
  REF_CELL local_100;
  REF_GEOM local_f8;
  REF_DBL *local_f0;
  int *local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  REF_INT local_b8 [28];
  REF_DBL local_48;
  REF_DBL RStack_40;
  undefined8 uStack_38;
  
  local_f8 = ref_facelift->grid->geom;
  *cell = -1;
  *bary = 0.0;
  bary[1] = 0.0;
  bary[2] = 0.0;
  local_108 = param;
  if (type == 2) {
    uVar3 = ref_list_create(&local_110);
    if (uVar3 == 0) {
      pRVar2 = ref_facelift->tri_cell;
      local_48 = *local_108;
      RStack_40 = local_108[1];
      uStack_38 = 0;
      local_f0 = bary;
      uVar3 = ref_search_touching(ref_facelift->face_search[(long)id + -1],local_110,&local_48,1e-12
                                 );
      if (uVar3 == 0) {
        local_100 = pRVar2;
        if (local_110->n < 1) {
          uVar3 = ref_list_free(local_110);
          if (uVar3 == 0) {
            return 0;
          }
          uVar4 = 0x253;
          goto LAB_001e9805;
        }
        iVar6 = -1;
        uVar9 = 0;
        uVar10 = 0xc08f3800;
        lVar5 = 0;
        local_e8 = cell;
        do {
          pRVar2 = local_100;
          local_e0 = (double)CONCAT44(uVar10,uVar9);
          RVar1 = local_110->value[lVar5];
          uVar3 = ref_cell_nodes(local_100,RVar1,local_b8);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar7 = "cell";
            uVar4 = 0x25a;
            goto LAB_001e98ad;
          }
          local_b8[3] = local_b8[pRVar2->node_per];
          uVar3 = ref_geom_bary3(local_f8,local_b8,local_108,&local_d8);
          pRVar2 = local_100;
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar7 = "bary";
            uVar4 = 0x25c;
            goto LAB_001e98ad;
          }
          uVar9 = SUB84(local_d8,0);
          uVar10 = (undefined4)((ulong)local_d8 >> 0x20);
          if (local_d0 <= local_d8) {
            uVar9 = SUB84(local_d0,0);
            uVar10 = (undefined4)((ulong)local_d0 >> 0x20);
          }
          if (local_c8 <= (double)CONCAT44(uVar10,uVar9)) {
            uVar9 = SUB84(local_c8,0);
            uVar10 = (undefined4)((ulong)local_c8 >> 0x20);
          }
          if (((double)CONCAT44(uVar10,uVar9) < local_e0 ||
              (double)CONCAT44(uVar10,uVar9) == local_e0) && iVar6 != -1) {
            uVar9 = SUB84(local_e0,0);
            uVar10 = (undefined4)((ulong)local_e0 >> 0x20);
            RVar1 = iVar6;
          }
          iVar6 = RVar1;
          lVar5 = lVar5 + 1;
        } while (lVar5 < local_110->n);
        if (iVar6 == -1) {
          uVar4 = 0x267;
          goto LAB_001e9900;
        }
        *local_e8 = iVar6;
        uVar3 = ref_cell_nodes(local_100,iVar6,local_b8);
        if (uVar3 == 0) {
          local_b8[3] = local_b8[pRVar2->node_per];
          uVar3 = ref_geom_bary3(local_f8,local_b8,local_108,local_f0);
          if (uVar3 == 0) {
            uVar3 = ref_list_free(local_110);
            if (uVar3 == 0) {
              return 0;
            }
            uVar8 = (ulong)uVar3;
            pcVar7 = "free list";
            uVar4 = 0x270;
          }
          else {
            uVar8 = (ulong)uVar3;
            pcVar7 = "bary";
            uVar4 = 0x26c;
          }
        }
        else {
          uVar8 = (ulong)uVar3;
          pcVar7 = "cell";
          uVar4 = 0x26a;
        }
        goto LAB_001e98ad;
      }
      pcVar7 = "touching";
      uVar4 = 0x250;
    }
    else {
      pcVar7 = "create list";
      uVar4 = 0x249;
    }
  }
  else {
    if (type != 1) {
      return 0;
    }
    uVar3 = ref_list_create(&local_110);
    if (uVar3 == 0) {
      pRVar2 = ref_facelift->edg_cell;
      local_48 = *local_108;
      RStack_40 = 0.0;
      uStack_38 = 0;
      local_e8 = cell;
      uVar3 = ref_search_touching(ref_facelift->edge_search[(long)id + -1],local_110,&local_48,1e-12
                                 );
      if (uVar3 == 0) {
        local_100 = pRVar2;
        if (local_110->n < 1) {
          uVar3 = ref_list_free(local_110);
          if (uVar3 == 0) {
            return 0;
          }
          uVar4 = 0x22d;
LAB_001e9805:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,uVar4,"ref_facelift_enclosing",(ulong)uVar3,"free list");
          return uVar3;
        }
        iVar6 = -1;
        uVar9 = 0;
        uVar10 = 0xc08f3800;
        lVar5 = 0;
        local_f0 = bary;
        do {
          pRVar2 = local_100;
          local_e0 = (double)CONCAT44(uVar10,uVar9);
          RVar1 = local_110->value[lVar5];
          uVar3 = ref_cell_nodes(local_100,RVar1,local_b8);
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar7 = "cell";
            uVar4 = 0x234;
            goto LAB_001e98ad;
          }
          local_b8[2] = local_b8[pRVar2->node_per];
          uVar3 = ref_geom_bary2(local_f8,local_b8,*local_108,&local_d8);
          pRVar2 = local_100;
          if (uVar3 != 0) {
            uVar8 = (ulong)uVar3;
            pcVar7 = "bary";
            uVar4 = 0x236;
            goto LAB_001e98ad;
          }
          uVar9 = SUB84(local_d8,0);
          uVar10 = (undefined4)((ulong)local_d8 >> 0x20);
          if (local_d0 <= local_d8) {
            uVar9 = SUB84(local_d0,0);
            uVar10 = (undefined4)((ulong)local_d0 >> 0x20);
          }
          if (((double)CONCAT44(uVar10,uVar9) < local_e0 ||
              (double)CONCAT44(uVar10,uVar9) == local_e0) && iVar6 != -1) {
            uVar9 = SUB84(local_e0,0);
            uVar10 = (undefined4)((ulong)local_e0 >> 0x20);
            RVar1 = iVar6;
          }
          iVar6 = RVar1;
          lVar5 = lVar5 + 1;
        } while (lVar5 < local_110->n);
        if (iVar6 == -1) {
          uVar4 = 0x23e;
LAB_001e9900:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,uVar4,"ref_facelift_enclosing","failed to find cell");
          return 1;
        }
        *local_e8 = iVar6;
        uVar3 = ref_cell_nodes(local_100,iVar6,local_b8);
        if (uVar3 == 0) {
          local_b8[2] = local_b8[pRVar2->node_per];
          uVar3 = ref_geom_bary2(local_f8,local_b8,*local_108,local_f0);
          if (uVar3 == 0) {
            uVar3 = ref_list_free(local_110);
            if (uVar3 == 0) {
              return 0;
            }
            uVar8 = (ulong)uVar3;
            pcVar7 = "free list";
            uVar4 = 0x245;
          }
          else {
            uVar8 = (ulong)uVar3;
            pcVar7 = "bary";
            uVar4 = 0x243;
          }
        }
        else {
          uVar8 = (ulong)uVar3;
          pcVar7 = "cell";
          uVar4 = 0x241;
        }
LAB_001e98ad:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               uVar4,"ref_facelift_enclosing",uVar8,pcVar7);
        return (REF_STATUS)uVar8;
      }
      pcVar7 = "touching";
      uVar4 = 0x22b;
    }
    else {
      pcVar7 = "create list";
      uVar4 = 0x224;
    }
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",uVar4,
         "ref_facelift_enclosing",(ulong)uVar3,pcVar7);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_enclosing(REF_FACELIFT ref_facelift,
                                          REF_INT type, REF_INT id,
                                          REF_DBL *param, REF_INT *cell,
                                          REF_DBL *bary) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_LIST ref_list;
  REF_SEARCH ref_search;
  REF_CELL ref_cell;
  REF_DBL parampad[3];
  REF_DBL fuzz = 1.0e-12;
  REF_INT item, candidate, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL current_bary[3], best_bary, min_bary;
  REF_INT best_candidate;
  REF_BOOL verbose = REF_FALSE;

  *cell = REF_EMPTY;
  bary[0] = 0.0;
  bary[1] = 0.0;
  bary[2] = 0.0;

  if (REF_GEOM_EDGE == type) {
    RSS(ref_list_create(&ref_list), "create list");
    ref_search = ref_facelift_edge_search(ref_facelift, id - 1);
    ref_cell = ref_facelift_edg(ref_facelift);
    parampad[0] = param[0];
    parampad[1] = 0.0;
    parampad[2] = 0.0;

    RSS(ref_search_touching(ref_search, ref_list, parampad, fuzz), "touching");
    if (0 >= ref_list_n(ref_list)) {
      RSS(ref_list_free(ref_list), "free list");
      return REF_SUCCESS;
    }
    best_candidate = REF_EMPTY;
    best_bary = -999.0;
    each_ref_list_item(ref_list, item) {
      candidate = ref_list_value(ref_list, item);
      RSS(ref_cell_nodes(ref_cell, candidate, nodes), "cell");
      nodes[2] = nodes[ref_cell_id_index(ref_cell)]; /* expects P1 */
      RSS(ref_geom_bary2(ref_geom, nodes, param[0], current_bary), "bary");
      min_bary = MIN(current_bary[0], current_bary[1]);
      if (REF_EMPTY == best_candidate || min_bary > best_bary) {
        best_candidate = candidate;
        best_bary = min_bary;
      }
    }

    RUS(REF_EMPTY, best_candidate, "failed to find cell");

    *cell = best_candidate;
    RSS(ref_cell_nodes(ref_cell, best_candidate, nodes), "cell");
    nodes[2] = nodes[ref_cell_id_index(ref_cell)]; /* expects P1 */
    RSS(ref_geom_bary2(ref_geom, nodes, param[0], bary), "bary");

    RSS(ref_list_free(ref_list), "free list");
  }

  if (REF_GEOM_FACE == type) {
    RSS(ref_list_create(&ref_list), "create list");
    ref_search = ref_facelift_face_search(ref_facelift, id - 1);
    ref_cell = ref_facelift_tri(ref_facelift);
    parampad[0] = param[0];
    parampad[1] = param[1];
    parampad[2] = 0.0;

    RSS(ref_search_touching(ref_search, ref_list, parampad, fuzz), "touching");
    if (verbose) printf("n touch %d\n", ref_list_n(ref_list));
    if (0 >= ref_list_n(ref_list)) {
      RSS(ref_list_free(ref_list), "free list");
      return REF_SUCCESS;
    }
    best_candidate = REF_EMPTY;
    best_bary = -999.0;
    each_ref_list_item(ref_list, item) {
      candidate = ref_list_value(ref_list, item);
      RSS(ref_cell_nodes(ref_cell, candidate, nodes), "cell");
      nodes[3] = nodes[ref_cell_id_index(ref_cell)]; /* expects P1 */
      RSS(ref_geom_bary3(ref_geom, nodes, param, current_bary), "bary");
      min_bary = MIN(MIN(current_bary[0], current_bary[1]), current_bary[2]);
      if (verbose)
        printf("bary %e %e %e\n", current_bary[0], current_bary[1],
               current_bary[2]);
      if (REF_EMPTY == best_candidate || min_bary > best_bary) {
        best_candidate = candidate;
        best_bary = min_bary;
      }
    }

    RUS(REF_EMPTY, best_candidate, "failed to find cell");

    *cell = best_candidate;
    RSS(ref_cell_nodes(ref_cell, best_candidate, nodes), "cell");
    nodes[3] = nodes[ref_cell_id_index(ref_cell)]; /* expects P1 */
    RSS(ref_geom_bary3(ref_geom, nodes, param, bary), "bary");

    if (verbose) printf("best %e %e %e\n", bary[0], bary[1], bary[2]);

    RSS(ref_list_free(ref_list), "free list");
  }

  return REF_SUCCESS;
}